

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O3

int __thiscall
fmt::v10::
formatter<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_char,_void>
::parse_unsigned_int
          (formatter<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_char,_void>
           *this,char *begin,char *end)

{
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  
  if (begin == end) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar4 = iVar2;
      bVar1 = *begin;
      if (9 < (byte)(bVar1 - 0x30)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "compile time error, this is not a digit.";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
      begin = (char *)((byte *)begin + 1);
      iVar2 = ((iVar4 + (uint)bVar1) * 2 + -0x60) * 5;
    } while (begin != end);
    iVar2 = iVar4 + (uint)bVar1 + -0x30;
  }
  return iVar2;
}

Assistant:

constexpr int parse_unsigned_int(const char* begin, const char* end) {
    int result = 0;
    while (begin != end) {
      if (!is_digit(*begin)) {
        throw "compile time error, this is not a digit.";  // NOLINT(hicpp-exception-baseclass)
      }
      result += (*begin - '0');
      result *= 10;
      ++begin;
    }
    result = result / 10;
    return result;
  }